

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstExpr.h
# Opt level: O3

void __thiscall
nigel::AstVariable::AstVariable
          (AstVariable *this,MemModel model,String *name,u8 address,BasicType type)

{
  (this->super_AstReturning).super_AstExpr.super_enable_shared_from_this<nigel::AstExpr>.
  _M_weak_this.super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_AstReturning).super_AstExpr.super_enable_shared_from_this<nigel::AstExpr>.
  _M_weak_this.super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_AstReturning).super_AstExpr.type = variable;
  (this->super_AstReturning).super_AstExpr.token.
  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_AstReturning).super_AstExpr.token.
  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_AstReturning).super_AstExpr._vptr_AstExpr = (_func_int **)&PTR__AstVariable_001835b8;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->scopeOffset = 0;
  this->predefinedAddress = '\0';
  *(MemModel *)&(this->super_AstReturning).field_0x34 = model;
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->predefinedAddress = address;
  (this->super_AstReturning).retType = type;
  return;
}

Assistant:

AstVariable( MemModel model, String name, u8 address, BasicType type ) : AstReturning( AstExpr::Type::variable )
		{
			this->model = model;
			this->name = name;
			predefinedAddress = address;
			retType = type;
		}